

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O3

void rw::wdgl::uninstance(ObjPipeline *rwpipe,Atomic *atomic)

{
  byte *pbVar1;
  AttribDesc *a;
  uint uVar2;
  Geometry *this;
  InstanceDataHeader *pIVar3;
  _func_void_ObjPipeline_ptr_Atomic_ptr *p_Var4;
  char cVar5;
  short sVar9;
  short sVar10;
  short sVar11;
  uint32 uVar12;
  int iVar13;
  uint8 *src;
  RGBA *pRVar14;
  long lVar15;
  V3d *dst;
  V3d *dst_00;
  TexCoords *dst_01;
  short sVar16;
  int iVar17;
  int iVar20;
  int iVar21;
  int iVar22;
  float32 f [4];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ObjPipeline *local_38;
  char cVar6;
  char cVar7;
  char cVar8;
  undefined4 uVar18;
  undefined6 uVar19;
  
  this = atomic->geometry;
  if ((this->flags & 0x1000000) != 0) {
    local_38 = rwpipe;
    uVar12 = MeshHeader::guessNumTriangles(this->meshHeader);
    this->numTriangles = uVar12;
    Geometry::allocateData(this);
    pIVar3 = this->instData;
    if (0 < (int)pIVar3[1].platform) {
      pRVar14 = this->colors;
      dst_01 = this->texCoords[0];
      dst = this->morphTargets->vertices;
      dst_00 = this->morphTargets->normals;
      lVar15 = 0;
      do {
        uVar2 = *(uint *)(*(long *)(pIVar3 + 2) + lVar15 * 0x18);
        if (uVar2 < 4) {
          a = (AttribDesc *)(*(long *)(pIVar3 + 2) + lVar15 * 0x18);
          src = (uint8 *)((ulong)a->offset + *(long *)(pIVar3 + 6));
          switch(uVar2) {
          case 0:
            if (0 < this->numVertices) {
              iVar13 = 0;
              do {
                unpackattrib((float *)dst,src,a,1.0);
                dst = dst + 1;
                src = src + a->stride;
                iVar13 = iVar13 + 1;
              } while (iVar13 < this->numVertices);
            }
            break;
          case 1:
            if (0 < this->numVertices) {
              iVar13 = 0;
              do {
                unpackattrib((float *)dst_01,src,a,512.0);
                dst_01 = dst_01 + 1;
                src = src + a->stride;
                iVar13 = iVar13 + 1;
              } while (iVar13 < this->numVertices);
            }
            break;
          case 2:
            if (0 < this->numVertices) {
              iVar13 = 0;
              do {
                unpackattrib((float *)dst_00,src,a,1.0);
                dst_00 = dst_00 + 1;
                src = src + a->stride;
                iVar13 = iVar13 + 1;
              } while (iVar13 < this->numVertices);
            }
            break;
          case 3:
            iVar13 = this->numVertices;
            if (0 < iVar13) {
              do {
                unpackattrib(&local_48,src,a,1.0);
                iVar17 = (int)(local_48 * 255.0);
                iVar20 = (int)(fStack_44 * 255.0);
                iVar21 = (int)(fStack_40 * 255.0);
                iVar22 = (int)(fStack_3c * 255.0);
                sVar9 = (short)iVar17;
                cVar5 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar17 - (0xff < sVar9);
                sVar9 = (short)((uint)iVar17 >> 0x10);
                sVar16 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * (char)((uint)iVar17 >> 0x10) -
                                  (0xff < sVar9),cVar5);
                sVar9 = (short)iVar20;
                cVar6 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar20 - (0xff < sVar9);
                sVar9 = (short)((uint)iVar20 >> 0x10);
                uVar18 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * (char)((uint)iVar20 >> 0x10) -
                                  (0xff < sVar9),CONCAT12(cVar6,sVar16));
                sVar9 = (short)iVar21;
                cVar7 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar21 - (0xff < sVar9);
                sVar9 = (short)((uint)iVar21 >> 0x10);
                uVar19 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * (char)((uint)iVar21 >> 0x10) -
                                  (0xff < sVar9),CONCAT14(cVar7,uVar18));
                sVar9 = (short)iVar22;
                cVar8 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar22 - (0xff < sVar9);
                sVar11 = (short)((uint)iVar22 >> 0x10);
                sVar9 = (short)((uint)uVar18 >> 0x10);
                sVar10 = (short)((uint6)uVar19 >> 0x20);
                sVar11 = (short)(CONCAT17((0 < sVar11) * (sVar11 < 0x100) *
                                          (char)((uint)iVar22 >> 0x10) - (0xff < sVar11),
                                          CONCAT16(cVar8,uVar19)) >> 0x30);
                pRVar14->red = (0 < sVar16) * (sVar16 < 0x100) * cVar5 - (0xff < sVar16);
                pRVar14->green = (0 < sVar9) * (sVar9 < 0x100) * cVar6 - (0xff < sVar9);
                pRVar14->blue = (0 < sVar10) * (sVar10 < 0x100) * cVar7 - (0xff < sVar10);
                pRVar14->alpha = (0 < sVar11) * (sVar11 < 0x100) * cVar8 - (0xff < sVar11);
                pRVar14 = pRVar14 + 1;
                src = src + a->stride;
                iVar13 = iVar13 + -1;
              } while (iVar13 != 0);
            }
          }
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < (int)pIVar3[1].platform);
    }
    p_Var4 = local_38[1].impl.instance;
    if (p_Var4 != (_func_void_ObjPipeline_ptr_Atomic_ptr *)0x0) {
      (*p_Var4)((ObjPipeline *)this,(Atomic *)this);
    }
    Geometry::generateTriangles(this,(int8 *)0x0);
    pbVar1 = (byte *)((long)&this->flags + 3);
    *pbVar1 = *pbVar1 & 0xfe;
    pIVar3 = this->instData;
    if ((pIVar3 != (InstanceDataHeader *)0x0) && (pIVar3->platform == 0xb)) {
      this->instData = (InstanceDataHeader *)0x0;
      (*DAT_0014ada0)(*(undefined8 *)(pIVar3 + 2));
      (*DAT_0014ada0)(*(undefined8 *)(pIVar3 + 6));
      (*DAT_0014ada0)(pIVar3);
    }
  }
  return;
}

Assistant:

static void
uninstance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	if((geo->flags & Geometry::NATIVE) == 0)
		return;
	assert(geo->instData != nil);
	assert(geo->instData->platform == PLATFORM_WDGL);
	geo->numTriangles = geo->meshHeader->guessNumTriangles();
	geo->allocateData();

	uint8 *p;
	TexCoords *texcoord = geo->texCoords[0];
	RGBA *color = geo->colors;
	V3d *vert = geo->morphTargets->vertices;
	V3d *norm = geo->morphTargets->normals;
	float32 f[4];

	InstanceDataHeader *header = (InstanceDataHeader*)geo->instData;
	for(int i = 0; i < header->numAttribs; i++){
		AttribDesc *a = &header->attribs[i];
		p = header->data + a->offset;

		switch(a->index){
		case 0:		// Vertices
			for(int32 i = 0; i < geo->numVertices; i++){
				unpackattrib((float32*)vert, p, a);
				vert++;
				p += a->stride;
			}
			break;

		case 1:		// texCoords
			for(int32 i = 0; i < geo->numVertices; i++){
				unpackattrib((float32*)texcoord, p, a, 512.0f);
				texcoord++;
				p += a->stride;
			}
			break;

		case 2:		// normals
			for(int32 i = 0; i < geo->numVertices; i++){
				unpackattrib((float32*)norm, p, a);
				norm++;
				p += a->stride;
			}
			break;

		case 3:		// colors
			for(int32 i = 0; i < geo->numVertices; i++){
				// TODO: this seems too complicated
				unpackattrib(f, p, a);
				color->red   = f[0]*255.0f;
				color->green = f[1]*255.0f;
				color->blue  = f[2]*255.0f;
				color->alpha = f[3]*255.0f;
				color++;
				p += a->stride;
			}
			break;
		}
	}

	if(pipe->uninstanceCB)
		pipe->uninstanceCB(geo);

	geo->generateTriangles();

	geo->flags &= ~Geometry::NATIVE;
	destroyNativeData(geo, 0, 0);
}